

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<unsigned_long,unsigned_long,unsigned_long,duckdb::BinaryStandardOperatorWrapper,duckdb::ModuloOperator,bool>
               (unsigned_long *ldata,unsigned_long *rdata,unsigned_long *result_data,
               SelectionVector *lsel,SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,
               ValidityMask *rvalidity,ValidityMask *result_validity,bool fun)

{
  bool bVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  long in_RDX;
  unsigned_long in_RSI;
  ValidityMask *in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  unsigned_long rentry_1;
  unsigned_long lentry_1;
  idx_t i_1;
  unsigned_long rentry;
  unsigned_long lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  ValidityMask *in_stack_ffffffffffffff78;
  ValidityMask *mask;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 fun_00;
  ulong local_68;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) &&
     (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                        ((TemplatedValidityMask<unsigned_long> *)rentry_1), bVar1)) {
    for (local_68 = 0; local_68 < in_R9; local_68 = local_68 + 1) {
      mask = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_68);
      fun_00 = (undefined1)
               ((ulong)(&(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)[iVar3] >>
               0x38);
      uVar2 = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_68);
      uVar2 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::ModuloOperator,unsigned_long,unsigned_long,unsigned_long>
                        ((bool)fun_00,*(unsigned_long *)(uVar2 + iVar3 * 8),uVar2,mask,0x1358916);
      *(unsigned_long *)(in_RDX + local_68 * 8) = uVar2;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff88,(idx_t)in_stack_ffffffffffffff80), bVar1)) {
        uVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::ModuloOperator,unsigned_long,unsigned_long,unsigned_long>
                          (SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),
                           (unsigned_long)in_stack_ffffffffffffff88,
                           (unsigned_long)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           0x1358844);
        *(unsigned_long *)(in_RDX + local_40 * 8) = uVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}